

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool __thiscall CNetAddr::IsRFC2544(CNetAddr *this)

{
  long in_FS_OFFSET;
  bool bVar1;
  
  if (this->m_net == NET_IPV4) {
    if (0x10 < (this->m_addr)._size) {
      this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    }
    if ((this->m_addr)._union.direct[0] == -0x3a) {
      bVar1 = ((this->m_addr)._union.direct[1] & 0xfeU) == 0x12;
      goto LAB_00583406;
    }
  }
  bVar1 = false;
LAB_00583406:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsRFC2544() const
{
    return IsIPv4() && m_addr[0] == 198 && (m_addr[1] == 18 || m_addr[1] == 19);
}